

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O0

void pybind11::detail::
     vector_accessor<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>
               (enable_if_t<_vector_needs_copy<vector<long>_>::value,_pybind11::class_<std::vector<long>,_std::unique_ptr<std::vector<long>_>_>_>
                *cl)

{
  anon_class_1_0_00000001_for_wrap_i wrap_i;
  keep_alive<0UL,_1UL> *in_stack_00000048;
  type *in_stack_00000050;
  char *in_stack_00000058;
  class_<std::vector<long,_std::allocator<long>_>,_std::unique_ptr<std::vector<long,_std::allocator<long>_>,_std::default_delete<std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_00000060;
  
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
  ::
  def<pybind11::detail::vector_accessor<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>(std::enable_if<_vector_needs_copy<std::vector<long,std::allocator<long>>>::value,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>::type&)::_lambda(std::vector<long,std::allocator<long>>&,long)_1_,pybind11::return_value_policy>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,
             (return_value_policy *)in_stack_00000048);
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
  ::
  def<pybind11::detail::vector_accessor<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>(std::enable_if<_vector_needs_copy<std::vector<long,std::allocator<long>>>::value,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>::type&)::_lambda(std::vector<long,std::allocator<long>>&)_1_,pybind11::keep_alive<0ul,1ul>>
            (in_stack_00000060,in_stack_00000058,(type *)in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void vector_accessor(enable_if_t<!vector_needs_copy<Vector>::value, Class_> &cl) {
    using T = typename Vector::value_type;
    using SizeType = typename Vector::size_type;
    using DiffType = typename Vector::difference_type;
    using ItType   = typename Vector::iterator;

    auto wrap_i = [](DiffType i, SizeType n) {
        if (i < 0)
            i += n;
        if (i < 0 || (SizeType)i >= n)
            throw index_error();
        return i;
    };

    cl.def("__getitem__",
        [wrap_i](Vector &v, DiffType i) -> T & {
            i = wrap_i(i, v.size());
            return v[(SizeType)i];
        },
        return_value_policy::reference_internal // ref + keepalive
    );

    cl.def("__iter__",
           [](Vector &v) {
               return make_iterator<
                   return_value_policy::reference_internal, ItType, ItType, T&>(
                   v.begin(), v.end());
           },
           keep_alive<0, 1>() /* Essential: keep list alive while iterator exists */
    );
}